

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_io_test.cc
# Opt level: O3

void __thiscall UnitTest_TestFileIO_Test::~UnitTest_TestFileIO_Test(UnitTest_TestFileIO_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(UnitTest, TestFileIO)
{
	char buf[24];
	size_t len = 20;
	size_t n;
	Qiniu_File *fp;

	Qiniu_Error err = Qiniu_File_Open(&fp, __FILE__);
	EXPECT_EQ(err.code, 200);

	buf[len] = '\0';

	n = Qiniu_File_ReadAt(fp, buf, len, 0);
	Qiniu_Log_Debug("%s, %d, %d, %d", buf, n, len, errno);
	EXPECT_EQ(n, len);

	n = Qiniu_File_ReadAt(fp, buf, len, 2);
	Qiniu_Log_Debug("%s, %d, %d, %d", buf, n, len, errno);
	EXPECT_EQ(n, len);

	Qiniu_File_Close(fp);
}